

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseExtensions
          (Parser *this,DescriptorProto *message,LocationRecorder *extensions_location)

{
  Location *parent;
  bool bVar1;
  int path1;
  Token *pTVar2;
  undefined1 local_c8 [8];
  LocationRecorder end_location_1;
  LocationRecorder end_location;
  undefined1 local_a0 [8];
  LocationRecorder start_location;
  Token start_token;
  int32 local_50;
  int end;
  int start;
  DescriptorProto_ExtensionRange *local_40;
  ExtensionRange *range;
  LocationRecorder location;
  LocationRecorder *extensions_location_local;
  DescriptorProto *message_local;
  Parser *this_local;
  
  location.location_ = (Location *)extensions_location;
  bVar1 = Consume(this,"extensions");
  if (bVar1) {
    do {
      parent = location.location_;
      path1 = DescriptorProto::extension_range_size(message);
      LocationRecorder::LocationRecorder
                ((LocationRecorder *)&range,(LocationRecorder *)parent,path1);
      local_40 = DescriptorProto::add_extension_range(message);
      LocationRecorder::RecordLegacyLocation
                ((LocationRecorder *)&range,&local_40->super_Message,NUMBER);
      io::Tokenizer::Token::Token((Token *)&start_location.location_);
      LocationRecorder::LocationRecorder((LocationRecorder *)local_a0,(LocationRecorder *)&range,1);
      pTVar2 = io::Tokenizer::current(this->input_);
      io::Tokenizer::Token::operator=((Token *)&start_location.location_,pTVar2);
      bVar1 = ConsumeInteger(this,&local_50,"Expected field number range.");
      if (!bVar1) {
        this_local._7_1_ = 0;
      }
      bVar1 = !bVar1;
      LocationRecorder::~LocationRecorder((LocationRecorder *)local_a0);
      if (!bVar1) {
        bVar1 = TryConsume(this,"to");
        if (bVar1) {
          LocationRecorder::LocationRecorder
                    ((LocationRecorder *)&end_location_1.location_,(LocationRecorder *)&range,2);
          bVar1 = TryConsume(this,"max");
          if (bVar1) {
            start_token._52_4_ = 0xfffffffe;
LAB_00356c97:
            bVar1 = false;
          }
          else {
            bVar1 = ConsumeInteger(this,(int *)&start_token.field_0x34,"Expected integer.");
            if (bVar1) goto LAB_00356c97;
            this_local._7_1_ = 0;
            bVar1 = true;
          }
          LocationRecorder::~LocationRecorder((LocationRecorder *)&end_location_1.location_);
          if (bVar1) goto LAB_00356d5f;
        }
        else {
          LocationRecorder::LocationRecorder
                    ((LocationRecorder *)local_c8,(LocationRecorder *)&range,2);
          LocationRecorder::StartAt((LocationRecorder *)local_c8,(Token *)&start_location.location_)
          ;
          LocationRecorder::EndAt((LocationRecorder *)local_c8,(Token *)&start_location.location_);
          start_token._52_4_ = local_50;
          LocationRecorder::~LocationRecorder((LocationRecorder *)local_c8);
        }
        start_token._52_4_ = start_token._52_4_ + 1;
        DescriptorProto_ExtensionRange::set_start(local_40,local_50);
        DescriptorProto_ExtensionRange::set_end(local_40,start_token._52_4_);
        bVar1 = false;
      }
LAB_00356d5f:
      io::Tokenizer::Token::~Token((Token *)&start_location.location_);
      LocationRecorder::~LocationRecorder((LocationRecorder *)&range);
      if (bVar1) goto LAB_00356ddf;
      bVar1 = TryConsume(this,",");
    } while (bVar1);
    bVar1 = ConsumeEndOfDeclaration(this,";",(LocationRecorder *)location.location_);
    if (bVar1) {
      this_local._7_1_ = 1;
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_00356ddf:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::ParseExtensions(DescriptorProto* message,
                             const LocationRecorder& extensions_location) {
  // Parse the declaration.
  DO(Consume("extensions"));

  do {
    // Note that kExtensionRangeFieldNumber was already pushed by the parent.
    LocationRecorder location(extensions_location,
                              message->extension_range_size());

    DescriptorProto::ExtensionRange* range = message->add_extension_range();
    location.RecordLegacyLocation(
        range, DescriptorPool::ErrorCollector::NUMBER);

    int start, end;
    io::Tokenizer::Token start_token;

    {
      LocationRecorder start_location(
          location, DescriptorProto::ExtensionRange::kStartFieldNumber);
      start_token = input_->current();
      DO(ConsumeInteger(&start, "Expected field number range."));
    }

    if (TryConsume("to")) {
      LocationRecorder end_location(
          location, DescriptorProto::ExtensionRange::kEndFieldNumber);
      if (TryConsume("max")) {
        // Set to the sentinel value - 1 since we increment the value below.
        // The actual value of the end of the range should be set with
        // AdjustExtensionRangesWithMaxEndNumber.
        end = kMaxExtensionRangeSentinel - 1;
      } else {
        DO(ConsumeInteger(&end, "Expected integer."));
      }
    } else {
      LocationRecorder end_location(
          location, DescriptorProto::ExtensionRange::kEndFieldNumber);
      end_location.StartAt(start_token);
      end_location.EndAt(start_token);
      end = start;
    }

    // Users like to specify inclusive ranges, but in code we like the end
    // number to be exclusive.
    ++end;

    range->set_start(start);
    range->set_end(end);
  } while (TryConsume(","));

  DO(ConsumeEndOfDeclaration(";", &extensions_location));
  return true;
}